

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayTex3DValidation.cpp
# Opt level: O3

bool __thiscall
glcts::TextureCubeMapArrayTex3DValidation::checkError
          (TextureCubeMapArrayTex3DValidation *this,GLint expectedError,char *message)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != expectedError) {
    local_1a0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    if (message == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
    }
    else {
      sVar2 = strlen(message);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,message,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198," Expected error: ",0x11);
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = expectedError;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198," Current error: ",0x10);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_198);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  return iVar1 == expectedError;
}

Assistant:

bool TextureCubeMapArrayTex3DValidation::checkError(glw::GLint expectedError, const char* message)
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	glw::GLint			  error  = gl.getError();
	bool				  result = true;

	if (error != expectedError)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << message << " Expected error: " << glu::getErrorStr(expectedError)
						   << " Current error: " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		result = false;
	}

	return result;
}